

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.hpp
# Opt level: O2

void __thiscall
duckdb::CatalogSetSecretStorage::~CatalogSetSecretStorage(CatalogSetSecretStorage *this)

{
  (this->super_SecretStorage)._vptr_SecretStorage =
       (_func_int **)&PTR__CatalogSetSecretStorage_02797d20;
  ::std::unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>::~unique_ptr
            (&(this->secrets).
              super_unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>);
  SecretStorage::~SecretStorage(&this->super_SecretStorage);
  return;
}

Assistant:

CatalogSetSecretStorage(DatabaseInstance &db_instance, const string &name_p, const int64_t offset)
	    : SecretStorage(name_p, offset), db(db_instance) {}